

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsInt __thiscall HighsSymmetryDetection::getOrbit(HighsSymmetryDetection *this,HighsInt vertex)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  HighsInt i;
  value_type_conflict2 local_24;
  
  piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = piVar2[(this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[vertex]];
  lVar6 = (long)iVar5;
  if (iVar5 != piVar2[lVar6]) {
    do {
      std::vector<int,_std::allocator<int>_>::push_back(&this->linkCompressionStack,&local_24);
      piVar2 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = piVar2[(int)lVar6];
      lVar6 = (long)iVar5;
    } while (iVar5 != piVar2[lVar6]);
    piVar3 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      piVar1 = piVar4 + -1;
      piVar4 = piVar4 + -1;
      piVar2[*piVar1] = iVar5;
    } while (piVar4 != piVar3);
    (this->linkCompressionStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  return iVar5;
}

Assistant:

HighsInt HighsSymmetryDetection::getOrbit(HighsInt vertex) {
  HighsInt i = vertexPosition[vertex];
  HighsInt orbit = orbitPartition[i];
  if (orbit != orbitPartition[orbit]) {
    do {
      linkCompressionStack.push_back(i);
      i = orbit;
      orbit = orbitPartition[orbit];
    } while (orbit != orbitPartition[orbit]);

    do {
      i = linkCompressionStack.back();
      linkCompressionStack.pop_back();
      orbitPartition[i] = orbit;
    } while (!linkCompressionStack.empty());
  }

  return orbit;
}